

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O2

int main(void)

{
  GLFWcursor *cursorHandle;
  double dVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  long lVar7;
  GLFWcursor *pGVar8;
  GLFWwindow *handle;
  GLFWcursor **ppGVar9;
  int iVar10;
  uchar uVar11;
  long lVar12;
  float fVar13;
  uint uVar14;
  uint uVar15;
  uint extraout_XMM0_Dc;
  uint uVar16;
  uint uVar17;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dd;
  uint uVar18;
  uint uVar19;
  uint extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  int fb_height;
  int fb_width;
  double local_4278;
  int wnd_width;
  undefined1 local_4268 [8];
  undefined8 local_4260;
  float local_4258;
  undefined4 local_4254;
  undefined8 local_4250;
  double local_4248;
  uint uStack_4240;
  uint uStack_423c;
  float local_4238;
  uint uStack_4234;
  uint uStack_4230;
  uint uStack_422c;
  int wnd_height;
  GLuint vertex_buffer;
  GLFWcursor *star_cursors [60];
  uchar buffer [4096];
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) goto LAB_00114e38;
  star_cursors[0] = (GLFWcursor *)0x2000000020;
  star_cursors[1] = (GLFWcursor *)buffer;
  lVar7 = 0;
  for (iVar2 = 0; iVar2 != 0x20; iVar2 = iVar2 + 1) {
    lVar7 = (long)(int)lVar7;
    for (iVar10 = -0x20; iVar10 != 0; iVar10 = iVar10 + 1) {
      uVar11 = -(iVar10 == -0x19 || iVar2 == 7);
      buffer[lVar7] = uVar11;
      (buffer + lVar7 + 1)[0] = '\0';
      (buffer + lVar7 + 1)[1] = '\0';
      buffer[lVar7 + 3] = uVar11;
      lVar7 = lVar7 + 4;
    }
  }
  tracking_cursor = glfwCreateCursor((GLFWimage *)star_cursors,7,7);
  if (tracking_cursor != (GLFWcursor *)0x0) {
    lVar7 = 0;
    uVar16 = extraout_XMM0_Dc;
    uVar18 = extraout_XMM0_Dd;
    do {
      if (lVar7 == 0x3c) {
        ppGVar9 = standard_cursors;
        lVar7 = 0;
        goto LAB_00114dd9;
      }
      local_4268._0_4_ = 0x40;
      local_4268._4_4_ = 0x40;
      local_4260 = buffer;
      local_4278 = (double)((float)(int)lVar7 / 60.0) * 6.283185307179586;
      lVar12 = 0;
      uVar14 = (uint)((ulong)local_4278 >> 0x20);
      for (iVar2 = 0; iVar2 != 0x40; iVar2 = iVar2 + 1) {
        fVar13 = (float)iVar2 + -32.0;
        local_4238 = fVar13 * fVar13;
        uVar15 = uVar14 & 0x7fffffff;
        uVar17 = uVar16 & 0x7fffffff;
        uVar19 = uVar18 & 0x7fffffff;
        local_4248 = (double)(CONCAT44(uVar14,fVar13) & 0x7fffffff7fffffff);
        lVar12 = (long)(int)lVar12;
        uStack_4240 = uVar17;
        uStack_423c = uVar19;
        uStack_4234 = uVar14;
        uStack_4230 = uVar16;
        uStack_422c = uVar18;
        for (iVar10 = 0; iVar10 != 0x40; iVar10 = iVar10 + 1) {
          (buffer + lVar12)[0] = 0xff;
          (buffer + lVar12)[1] = 0xff;
          buffer[lVar12 + 2] = 0xff;
          dVar1 = sin(local_4278);
          fVar13 = (float)dVar1 * 0.25 + 0.75;
          fVar24 = fVar13 * 3.0;
          fVar20 = (float)iVar10 + -32.0;
          fVar23 = 32.0;
          if (iVar10 != 0x20) {
            fVar23 = fVar24 / ABS(fVar20);
          }
          fVar25 = 32.0;
          if (iVar2 != 0x20) {
            fVar25 = fVar24 / local_4248._0_4_;
          }
          fVar20 = SQRT(fVar20 * fVar20 + local_4238) * -0.03125 + 1.0;
          dVar1 = (double)(fVar13 * fVar20 * 0.2 + fVar20 * fVar23 * fVar25);
          if (1.0 <= dVar1) {
            dVar1 = 1.0;
          }
          if (dVar1 <= 0.0) {
            dVar1 = 0.0;
          }
          uVar15 = (uint)((ulong)dVar1 >> 0x20);
          buffer[lVar12 + 3] = (uchar)(int)((float)dVar1 * 255.0);
          lVar12 = lVar12 + 4;
          uVar17 = extraout_XMM0_Dc_00;
          uVar19 = extraout_XMM0_Dd_00;
        }
        uVar14 = uVar15;
        uVar16 = uVar17;
        uVar18 = uVar19;
      }
      pGVar8 = glfwCreateCursor((GLFWimage *)local_4268,0x20,0x20);
      star_cursors[lVar7] = pGVar8;
      lVar7 = lVar7 + 1;
      uVar16 = extraout_XMM0_Dc_01;
      uVar18 = extraout_XMM0_Dd_01;
    } while (pGVar8 != (GLFWcursor *)0x0);
  }
  goto LAB_00114e33;
  while( true ) {
    pGVar8 = glfwCreateStandardCursor(*(int *)((long)&DAT_0012a170 + lVar7));
    *ppGVar9 = pGVar8;
    lVar7 = lVar7 + 4;
    ppGVar9 = ppGVar9 + 1;
    if (pGVar8 == (GLFWcursor *)0x0) break;
LAB_00114dd9:
    if (lVar7 == 0x18) {
      glfwWindowHint(0x22002,2);
      glfwWindowHint(0x22003,0);
      handle = glfwCreateWindow(0x280,0x1e0,"Cursor Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(handle);
        gladLoadGL(glfwGetProcAddress);
        (*glad_glGenBuffers)(1,&vertex_buffer);
        (*glad_glBindBuffer)(0x8892,vertex_buffer);
        GVar3 = (*glad_glCreateShader)(0x8b31);
        pGVar8 = (GLFWcursor *)0x0;
        (*glad_glShaderSource)(GVar3,1,&vertex_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar3);
        GVar4 = (*glad_glCreateShader)(0x8b30);
        (*glad_glShaderSource)(GVar4,1,&fragment_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar4);
        GVar5 = (*glad_glCreateProgram)();
        (*glad_glAttachShader)(GVar5,GVar3);
        (*glad_glAttachShader)(GVar5,GVar4);
        (*glad_glLinkProgram)(GVar5);
        GVar6 = (*glad_glGetUniformLocation)(GVar5,"MVP");
        GVar3 = (*glad_glGetAttribLocation)(GVar5,"vPos");
        (*glad_glEnableVertexAttribArray)(GVar3);
        (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
        (*glad_glUseProgram)(GVar5);
        glfwGetCursorPos(handle,&cursor_x,&cursor_y);
        printf("Cursor position: %f %f\n",SUB84(cursor_x,0),cursor_y);
        glfwSetCursorPosCallback(handle,cursor_position_callback);
        glfwSetKeyCallback(handle,key_callback);
        while (iVar2 = glfwWindowShouldClose(handle), iVar2 == 0) {
          (*glad_glClear)(0x4000);
          if (track_cursor != 0) {
            glfwGetWindowSize(handle,&wnd_width,&wnd_height);
            glfwGetFramebufferSize(handle,&fb_width,&fb_height);
            (*glad_glViewport)(0,0,fb_width,fb_height);
            iVar2 = fb_height;
            local_4238 = (float)fb_width;
            local_4248 = (double)fb_height;
            local_4268._0_4_ = 0x3f000000;
            local_4278 = (double)(local_4238 / (float)wnd_width);
            dVar1 = floor(cursor_y * local_4278);
            fVar13 = (float)((local_4248 - dVar1) + -1.0 + 0.5);
            local_4268._4_4_ = fVar13;
            local_4260 = (uchar *)CONCAT44(fVar13,local_4238 + 0.5);
            dVar1 = floor(local_4278 * cursor_x);
            local_4254 = 0x3f000000;
            local_4258 = (float)dVar1 + 0.5;
            local_4250 = CONCAT44((float)iVar2 + 0.5,local_4258);
            (*glad_glBufferData)(0x8892,0x20,local_4268,0x88e0);
            buffer[4] = '\0';
            buffer[5] = '\0';
            buffer[6] = '\0';
            buffer[7] = '\0';
            buffer[8] = '\0';
            buffer[9] = '\0';
            buffer[10] = '\0';
            buffer[0xb] = '\0';
            buffer[0xc] = '\0';
            buffer[0xd] = '\0';
            buffer[0xe] = '\0';
            buffer[0xf] = '\0';
            buffer[0x10] = '\0';
            buffer[0x11] = '\0';
            buffer[0x12] = '\0';
            buffer[0x13] = '\0';
            fVar13 = (float)fb_width;
            fVar20 = (float)fb_height;
            auVar21._0_8_ = CONCAT44(fVar20,fVar13) ^ 0x8000000080000000;
            auVar21._8_4_ = 0x80000000;
            auVar21._12_4_ = 0x80000000;
            auVar22._4_4_ = fVar20;
            auVar22._0_4_ = fVar13;
            auVar22._8_8_ = 0;
            auVar22 = divps(auVar21,auVar22);
            buffer._48_4_ = auVar22._0_4_;
            buffer._52_4_ = auVar22._4_4_;
            buffer[0x28] = '\0';
            buffer[0x29] = '\0';
            buffer[0x2a] = '\0';
            buffer[0x2b] = 0xc0;
            buffer[0x2c] = '\0';
            buffer[0x2d] = '\0';
            buffer[0x2e] = '\0';
            buffer[0x2f] = '\0';
            buffer[0x18] = '\0';
            buffer[0x19] = '\0';
            buffer[0x1a] = '\0';
            buffer[0x1b] = '\0';
            buffer[0x1c] = '\0';
            buffer[0x1d] = '\0';
            buffer[0x1e] = '\0';
            buffer[0x1f] = '\0';
            buffer[0x20] = '\0';
            buffer[0x21] = '\0';
            buffer[0x22] = '\0';
            buffer[0x23] = '\0';
            buffer[0x24] = '\0';
            buffer[0x25] = '\0';
            buffer[0x26] = '\0';
            buffer[0x27] = '\0';
            buffer._0_4_ = 2.0 / fVar13;
            buffer._20_4_ = 2.0 / fVar20;
            buffer[0x38] = '\0';
            buffer[0x39] = '\0';
            buffer[0x3a] = 0x80;
            buffer[0x3b] = 0xbf;
            buffer[0x3c] = '\0';
            buffer[0x3d] = '\0';
            buffer[0x3e] = 0x80;
            buffer[0x3f] = '?';
            (*glad_glUniformMatrix4fv)(GVar6,1,'\0',(GLfloat *)buffer);
            (*glad_glDrawArrays)(1,0,4);
          }
          glfwSwapBuffers(handle);
          if (animate_cursor == 0) {
            pGVar8 = (GLFWcursor *)0x0;
          }
          else {
            dVar1 = glfwGetTime();
            cursorHandle = star_cursors[(int)(dVar1 * 30.0) % 0x3c];
            if (pGVar8 != cursorHandle) {
              glfwSetCursor(handle,cursorHandle);
              pGVar8 = cursorHandle;
            }
          }
          if (wait_events == 0) {
            glfwPollEvents();
          }
          else if (animate_cursor == 0) {
            glfwWaitEvents();
          }
          else {
            glfwWaitEventsTimeout(0.03333333333333333);
          }
          fflush(_stdout);
        }
        glfwDestroyWindow(handle);
        for (lVar7 = 0; lVar7 != 0x3c; lVar7 = lVar7 + 1) {
          glfwDestroyCursor(star_cursors[lVar7]);
        }
        for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 8) {
          glfwDestroyCursor(*(GLFWcursor **)((long)standard_cursors + lVar7));
        }
        glfwTerminate();
        exit(0);
      }
      break;
    }
  }
LAB_00114e33:
  glfwTerminate();
LAB_00114e38:
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLFWwindow* window;
    GLFWcursor* star_cursors[CURSOR_FRAME_COUNT];
    GLFWcursor* current_frame = NULL;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    tracking_cursor = create_tracking_cursor();
    if (!tracking_cursor)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
    {
        star_cursors[i] = create_cursor_frame(i / (float) CURSOR_FRAME_COUNT);
        if (!star_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
    {
        const int shapes[] = {
            GLFW_ARROW_CURSOR,
            GLFW_IBEAM_CURSOR,
            GLFW_CROSSHAIR_CURSOR,
            GLFW_HAND_CURSOR,
            GLFW_HRESIZE_CURSOR,
            GLFW_VRESIZE_CURSOR
        };

        standard_cursors[i] = glfwCreateStandardCursor(shapes[i]);
        if (!standard_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(640, 480, "Cursor Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vec2), (void*) 0);
    glUseProgram(program);

    glfwGetCursorPos(window, &cursor_x, &cursor_y);
    printf("Cursor position: %f %f\n", cursor_x, cursor_y);

    glfwSetCursorPosCallback(window, cursor_position_callback);
    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        if (track_cursor)
        {
            int wnd_width, wnd_height, fb_width, fb_height;
            float scale;
            vec2 vertices[4];
            mat4x4 mvp;

            glfwGetWindowSize(window, &wnd_width, &wnd_height);
            glfwGetFramebufferSize(window, &fb_width, &fb_height);

            glViewport(0, 0, fb_width, fb_height);

            scale = (float) fb_width / (float) wnd_width;
            vertices[0][0] = 0.5f;
            vertices[0][1] = (float) (fb_height - floor(cursor_y * scale) - 1.f + 0.5f);
            vertices[1][0] = (float) fb_width + 0.5f;
            vertices[1][1] = (float) (fb_height - floor(cursor_y * scale) - 1.f + 0.5f);
            vertices[2][0] = (float) floor(cursor_x * scale) + 0.5f;
            vertices[2][1] = 0.5f;
            vertices[3][0] = (float) floor(cursor_x * scale) + 0.5f;
            vertices[3][1] = (float) fb_height + 0.5f;

            glBufferData(GL_ARRAY_BUFFER,
                         sizeof(vertices),
                         vertices,
                         GL_STREAM_DRAW);

            mat4x4_ortho(mvp, 0.f, (float) fb_width, 0.f, (float) fb_height, 0.f, 1.f);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);

            glDrawArrays(GL_LINES, 0, 4);
        }

        glfwSwapBuffers(window);

        if (animate_cursor)
        {
            const int i = (int) (glfwGetTime() * 30.0) % CURSOR_FRAME_COUNT;
            if (current_frame != star_cursors[i])
            {
                glfwSetCursor(window, star_cursors[i]);
                current_frame = star_cursors[i];
            }
        }
        else
            current_frame = NULL;

        if (wait_events)
        {
            if (animate_cursor)
                glfwWaitEventsTimeout(1.0 / 30.0);
            else
                glfwWaitEvents();
        }
        else
            glfwPollEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwDestroyWindow(window);

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
        glfwDestroyCursor(star_cursors[i]);

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
        glfwDestroyCursor(standard_cursors[i]);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}